

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

aiAnimation * __thiscall Assimp::Ogre::Animation::ConvertToAssimpAnimation(Animation *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  aiAnimation *this_00;
  size_type sVar3;
  ulong uVar4;
  aiNodeAnim **ppaVar5;
  reference this_01;
  aiNodeAnim *paVar6;
  size_t len;
  size_t i;
  aiAnimation *anim;
  Animation *this_local;
  
  this_00 = (aiAnimation *)operator_new(0x448);
  aiAnimation::aiAnimation(this_00);
  aiString::operator=((aiString *)this_00,&this->name);
  this_00->mDuration = (double)this->length;
  this_00->mTicksPerSecond = 1.0;
  bVar2 = std::
          vector<Assimp::Ogre::VertexAnimationTrack,_std::allocator<Assimp::Ogre::VertexAnimationTrack>_>
          ::empty(&this->tracks);
  if (!bVar2) {
    sVar3 = std::
            vector<Assimp::Ogre::VertexAnimationTrack,_std::allocator<Assimp::Ogre::VertexAnimationTrack>_>
            ::size(&this->tracks);
    this_00->mNumChannels = (uint)sVar3;
    auVar1 = ZEXT416(this_00->mNumChannels) * ZEXT816(8);
    uVar4 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    ppaVar5 = (aiNodeAnim **)operator_new__(uVar4);
    this_00->mChannels = ppaVar5;
    len = 0;
    sVar3 = std::
            vector<Assimp::Ogre::VertexAnimationTrack,_std::allocator<Assimp::Ogre::VertexAnimationTrack>_>
            ::size(&this->tracks);
    for (; len < sVar3; len = len + 1) {
      this_01 = std::
                vector<Assimp::Ogre::VertexAnimationTrack,_std::allocator<Assimp::Ogre::VertexAnimationTrack>_>
                ::operator[](&this->tracks,len);
      paVar6 = VertexAnimationTrack::ConvertToAssimpAnimationNode(this_01,this->parentSkeleton);
      this_00->mChannels[len] = paVar6;
    }
  }
  return this_00;
}

Assistant:

aiAnimation *Animation::ConvertToAssimpAnimation()
{
    aiAnimation *anim = new aiAnimation();
    anim->mName = name;
    anim->mDuration = static_cast<double>(length);
    anim->mTicksPerSecond = 1.0;

    // Tracks
    if (!tracks.empty())
    {
        anim->mNumChannels = static_cast<unsigned int>(tracks.size());
        anim->mChannels = new aiNodeAnim*[anim->mNumChannels];

        for(size_t i=0, len=tracks.size(); i<len; ++i)
        {
            anim->mChannels[i] = tracks[i].ConvertToAssimpAnimationNode(parentSkeleton);
        }
    }
    return anim;
}